

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::setState
          (VertexArrayObjectTest *this,VertexArrayState *state)

{
  GLboolean normalized;
  GLint GVar1;
  GLsizei GVar2;
  GLenum GVar3;
  deBool dVar4;
  reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  GLuint local_1c;
  int attribNdx;
  VertexArrayState *state_local;
  VertexArrayObjectTest *this_local;
  
  do {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_buffers,(long)state->elementArrayBuffer);
    glwBindBuffer(0x8893,*pvVar5);
    GVar3 = glwGetError();
    glu::checkError(GVar3,
                    "glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_buffers[state.elementArrayBuffer])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0x224);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  for (local_1c = 0;
      sVar6 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
              ::size(&state->attributes), (int)local_1c < (int)sVar6; local_1c = local_1c + 1) {
    do {
      pvVar7 = std::
               vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::operator[](&state->attributes,(long)(int)local_1c);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_buffers,(long)pvVar7->bufferNdx);
      glwBindBuffer(0x8892,*pvVar5);
      GVar3 = glwGetError();
      glu::checkError(GVar3,
                      "glBindBuffer(GL_ARRAY_BUFFER, m_buffers[state.attributes[attribNdx].bufferNdx])"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0x228);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    pvVar7 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[](&state->attributes,(long)(int)local_1c);
    if (pvVar7->enabled == '\0') {
      do {
        glwDisableVertexAttribArray(local_1c);
        GVar3 = glwGetError();
        glu::checkError(GVar3,"glDisableVertexAttribArray(attribNdx)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                        ,0x22c);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
    }
    else {
      do {
        glwEnableVertexAttribArray(local_1c);
        GVar3 = glwGetError();
        glu::checkError(GVar3,"glEnableVertexAttribArray(attribNdx)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                        ,0x22a);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
    }
    pvVar7 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
             ::operator[](&state->attributes,(long)(int)local_1c);
    if (pvVar7->integer == '\0') {
      do {
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        GVar1 = pvVar7->size;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        GVar3 = pvVar7->type;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        normalized = pvVar7->normalized;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        GVar2 = pvVar7->stride;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        glwVertexAttribPointer(local_1c,GVar1,GVar3,normalized,GVar2,(void *)(long)pvVar7->offset);
        GVar3 = glwGetError();
        glu::checkError(GVar3,
                        "glVertexAttribPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].normalized, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                        ,0x231);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
    }
    else {
      do {
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        GVar1 = pvVar7->size;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        GVar3 = pvVar7->type;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        GVar2 = pvVar7->stride;
        pvVar7 = std::
                 vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                 ::operator[](&state->attributes,(long)(int)local_1c);
        glwVertexAttribIPointer(local_1c,GVar1,GVar3,GVar2,(void *)(long)pvVar7->offset);
        GVar3 = glwGetError();
        glu::checkError(GVar3,
                        "glVertexAttribIPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                        ,0x22f);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
    }
    do {
      pvVar7 = std::
               vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::operator[](&state->attributes,(long)(int)local_1c);
      glwVertexAttribDivisor(local_1c,pvVar7->divisor);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glVertexAttribDivisor(attribNdx, state.attributes[attribNdx].divisor)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0x233);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
  }
  return;
}

Assistant:

void VertexArrayObjectTest::setState (const VertexArrayState& state)
{
	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_buffers[state.elementArrayBuffer]));

	for (int attribNdx = 0; attribNdx < (int)state.attributes.size(); attribNdx++)
	{
		GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_buffers[state.attributes[attribNdx].bufferNdx]));
		if (state.attributes[attribNdx].enabled)
			GLU_CHECK_CALL(glEnableVertexAttribArray(attribNdx));
		else
			GLU_CHECK_CALL(glDisableVertexAttribArray(attribNdx));

		if (state.attributes[attribNdx].integer)
			GLU_CHECK_CALL(glVertexAttribIPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset)));
		else
			GLU_CHECK_CALL(glVertexAttribPointer(attribNdx, state.attributes[attribNdx].size, state.attributes[attribNdx].type, state.attributes[attribNdx].normalized, state.attributes[attribNdx].stride, (const GLvoid*)((GLintptr)state.attributes[attribNdx].offset)));

		GLU_CHECK_CALL(glVertexAttribDivisor(attribNdx, state.attributes[attribNdx].divisor));
	}
}